

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  Fad<double> *pFVar6;
  Fad<double> *pFVar7;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar8;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar9;
  Fad<double> *pFVar10;
  Fad<double> *pFVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pFVar4 = (this->left_->fadexpr_).left_;
  pFVar5 = (this->left_->fadexpr_).right_;
  pFVar6 = (pFVar4->fadexpr_).left_;
  pFVar7 = (pFVar4->fadexpr_).right_;
  dVar1 = pFVar7->val_;
  dVar2 = pFVar6->val_;
  dVar3 = pFVar5->val_;
  dVar12 = dVar1 * dVar2;
  pFVar8 = (this->right_->fadexpr_).left_;
  pFVar9 = (this->right_->fadexpr_).right_;
  pFVar10 = (pFVar8->fadexpr_).right_;
  dVar14 = (double)(pFVar8->fadexpr_).left_.constant_ + pFVar10->val_;
  pFVar11 = (pFVar9->fadexpr_).right_;
  dVar15 = (double)(pFVar9->fadexpr_).left_.constant_ + pFVar11->val_;
  dVar13 = dVar14 * dVar15;
  return ((((pFVar6->dx_).ptr_to_data[i] * dVar1 + (pFVar7->dx_).ptr_to_data[i] * dVar2) * dVar3 +
          (pFVar5->dx_).ptr_to_data[i] * dVar12) * dVar13 -
         dVar12 * dVar3 *
         (dVar15 * (pFVar10->dx_).ptr_to_data[i] + dVar14 * (pFVar11->dx_).ptr_to_data[i])) /
         (dVar13 * dVar13);
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}